

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,
          NodeSourceInfoBuilderPair builderPair,bool isInUnion)

{
  uint uVar1;
  SegmentReader *pSVar2;
  CapTableReader *pCVar3;
  void *pvVar4;
  WirePointer *pWVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  undefined4 uVar9;
  PointerType PVar10;
  uint uVar11;
  Which WVar12;
  ArrayPtr<const_char> AVar13;
  undefined1 local_78 [24];
  int local_60;
  undefined4 uStack_5c;
  StructPointerCount local_54;
  int local_50;
  PointerReader local_48;
  
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  if ((decl->_reader).pointerCount == 0) {
    local_48.capTable = (CapTableReader *)0x0;
    local_48.pointer = (WirePointer *)0x0;
    local_48.segment = (SegmentReader *)0x0;
    local_48.nestingLimit = 0x7fffffff;
  }
  else {
    local_48.segment = (decl->_reader).segment;
    local_48.capTable = (decl->_reader).capTable;
    local_48.pointer = (decl->_reader).pointers;
    local_48.nestingLimit = (decl->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getStruct((StructReader *)local_78,&local_48,(word *)0x0);
  local_48.pointer = (WirePointer *)0x0;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  if (local_54 != 0) {
    local_48.pointer = (WirePointer *)CONCAT44(uStack_5c,local_60);
    local_48.segment = (SegmentReader *)local_78._0_8_;
    local_48.capTable = (CapTableReader *)local_78._8_8_;
    local_48.nestingLimit = local_50;
  }
  WVar12 = FILE;
  AVar13 = (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>(&local_48,(void *)0x0,0);
  (this->name).content = AVar13;
  pSVar2 = (decl->_reader).segment;
  pCVar3 = (decl->_reader).capTable;
  pvVar4 = (decl->_reader).data;
  pWVar5 = (decl->_reader).pointers;
  SVar6 = (decl->_reader).pointerCount;
  uVar7 = *(undefined2 *)&(decl->_reader).field_0x26;
  iVar8 = (decl->_reader).nestingLimit;
  uVar9 = *(undefined4 *)&(decl->_reader).field_0x2c;
  (this->declId)._reader.dataSize = (decl->_reader).dataSize;
  (this->declId)._reader.pointerCount = SVar6;
  *(undefined2 *)&(this->declId)._reader.field_0x26 = uVar7;
  (this->declId)._reader.nestingLimit = iVar8;
  *(undefined4 *)&(this->declId)._reader.field_0x2c = uVar9;
  (this->declId)._reader.data = pvVar4;
  (this->declId)._reader.pointers = pWVar5;
  (this->declId)._reader.segment = pSVar2;
  (this->declId)._reader.capTable = pCVar3;
  if (0x1f < (decl->_reader).dataSize) {
    WVar12 = *(Which *)((long)(decl->_reader).data + 2);
  }
  this->declKind = WVar12;
  this->isParam = false;
  this->hasDefaultValue = false;
  (this->fieldType)._reader.segment = (SegmentReader *)0x0;
  (this->fieldType)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldType)._reader.data = (void *)0x0;
  (this->fieldType)._reader.pointers = (WirePointer *)0x0;
  uVar11 = 0;
  *(undefined8 *)((long)&(this->fieldType)._reader.pointers + 6) = 0;
  local_60 = 0x7fffffff;
  (this->fieldType)._reader.nestingLimit = 0x7fffffff;
  (this->fieldDefaultValue)._reader.segment = (SegmentReader *)0x0;
  (this->fieldDefaultValue)._reader.capTable = (CapTableReader *)0x0;
  (this->fieldDefaultValue)._reader.data = (void *)0x0;
  (this->fieldDefaultValue)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->fieldDefaultValue)._reader.pointers + 6) = 0;
  (this->fieldDefaultValue)._reader.nestingLimit = 0x7fffffff;
  local_78._8_8_ = (CapTableReader *)0x0;
  local_78._16_8_ = (WirePointer *)0x0;
  local_78._0_8_ = (SegmentReader *)0x0;
  if (3 < (decl->_reader).pointerCount) {
    local_78._0_8_ = (decl->_reader).segment;
    local_78._8_8_ = (decl->_reader).capTable;
    local_78._16_8_ = (decl->_reader).pointers + 3;
    local_60 = (decl->_reader).nestingLimit;
  }
  capnp::_::PointerReader::getList
            (&(this->declAnnotations).reader,(PointerReader *)local_78,INLINE_COMPOSITE,(word *)0x0)
  ;
  uVar1 = (decl->_reader).dataSize;
  if (0x3f < uVar1) {
    uVar11 = *(uint *)((long)(decl->_reader).data + 4);
  }
  this->startByte = uVar11;
  uVar11 = 0;
  if (0x5f < uVar1) {
    uVar11 = *(uint *)((long)(decl->_reader).data + 8);
  }
  this->endByte = uVar11;
  WVar12 = FILE;
  (this->docComment).ptr.isSet = false;
  (this->schema).ptr.isSet = false;
  (this->node)._builder.segment = builderPair.node._builder.segment;
  (this->node)._builder.capTable = builderPair.node._builder.capTable;
  (this->node)._builder.data = builderPair.node._builder.data;
  (this->node)._builder.pointers = builderPair.node._builder.pointers;
  (this->node)._builder.dataSize = builderPair.node._builder.dataSize;
  (this->node)._builder.pointerCount = builderPair.node._builder.pointerCount;
  *(undefined2 *)&(this->node)._builder.field_0x26 = builderPair.node._builder._38_2_;
  (this->sourceInfo)._builder.segment = builderPair.sourceInfo._builder.segment;
  (this->sourceInfo)._builder.capTable = builderPair.sourceInfo._builder.capTable;
  (this->sourceInfo)._builder.data = builderPair.sourceInfo._builder.data;
  (this->sourceInfo)._builder.pointers = builderPair.sourceInfo._builder.pointers;
  (this->sourceInfo)._builder.dataSize = builderPair.sourceInfo._builder.dataSize;
  (this->sourceInfo)._builder.pointerCount = builderPair.sourceInfo._builder.pointerCount;
  *(undefined2 *)&(this->sourceInfo)._builder.field_0x26 = builderPair.sourceInfo._builder._38_2_;
  (this->field_21).fieldScope = (StructOrGroup *)0x0;
  if (0x1f < (decl->_reader).dataSize) {
    WVar12 = *(Which *)((long)(decl->_reader).data + 2);
  }
  local_78._2_2_ = FIELD;
  local_78._0_2_ = WVar12;
  local_78._8_8_ = " != ";
  local_78._16_8_ = &DAT_00000005;
  local_60 = CONCAT31(local_60._1_3_,WVar12 != FIELD);
  if (WVar12 != FIELD) {
    if ((decl->_reader).pointerCount < 5) {
      local_78._0_8_ = (SegmentReader *)0x0;
      local_78._8_8_ = (CapTableReader *)0x0;
      local_78._16_8_ = (WirePointer *)0x0;
      local_60 = 0x7fffffff;
    }
    else {
      local_78._0_8_ = (decl->_reader).segment;
      local_78._8_8_ = (decl->_reader).capTable;
      local_78._16_8_ = (decl->_reader).pointers + 4;
      local_60 = (decl->_reader).nestingLimit;
    }
    PVar10 = capnp::_::PointerReader::getPointerType((PointerReader *)local_78);
    if (PVar10 != NULL_) {
      if ((decl->_reader).pointerCount < 5) {
        local_60 = 0x7fffffff;
        local_78._8_8_ = (CapTableReader *)0x0;
        local_78._16_8_ = (WirePointer *)0x0;
        local_78._0_8_ = (SegmentReader *)0x0;
      }
      else {
        local_78._0_8_ = (decl->_reader).segment;
        local_78._8_8_ = (decl->_reader).capTable;
        local_78._16_8_ = (decl->_reader).pointers + 4;
        local_60 = (decl->_reader).nestingLimit;
      }
      AVar13 = (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_78,(void *)0x0,0);
      if ((this->docComment).ptr.isSet == true) {
        (this->docComment).ptr.isSet = false;
      }
      (this->docComment).ptr.field_1.value.super_StringPtr.content = AVar13;
      (this->docComment).ptr.isSet = true;
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
            ((Fault *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x452,FAILED,"decl.which() != Declaration::FIELD","_kjCondition,",
             (DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
              *)local_78);
  kj::_::Debug::Fault::fatal((Fault *)&local_48);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      NodeSourceInfoBuilderPair builderPair,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(decl.which()),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(builderPair.node), sourceInfo(builderPair.sourceInfo), unionScope(nullptr) {
      KJ_REQUIRE(decl.which() != Declaration::FIELD);
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }